

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_impl.hpp
# Opt level: O0

void __thiscall
xmotion::
Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
::AddEdge(Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
          *this,shared_ptr<xmotion::StateExample> *sstate,shared_ptr<xmotion::StateExample> *dstate,
         double trans)

{
  bool bVar1;
  Vertex *__args;
  pointer pEVar2;
  ostream *poVar3;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>,_false>
  __x;
  shared_ptr<xmotion::StateExample> *in_RSI;
  Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
  *in_RDI;
  double in_XMM0_Qa;
  vertex_iterator dst_vertex;
  edge_iterator it;
  vertex_iterator src_vertex;
  Vertex *in_stack_ffffffffffffff28;
  shared_ptr<xmotion::StateExample> *in_stack_ffffffffffffff30;
  list<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::vertex_iterator,_std::allocator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::vertex_iterator>_>
  *in_stack_ffffffffffffff40;
  double dVar4;
  list<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge,_std::allocator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>_>
  *this_00;
  shared_ptr<xmotion::StateExample> local_80;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>,_false>
  local_70;
  _Self local_68;
  _List_node_base *in_stack_ffffffffffffffa0;
  Vertex *in_stack_ffffffffffffffa8;
  _Self local_50 [5];
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>,_false>
  local_28;
  double local_20;
  
  local_20 = in_XMM0_Qa;
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            (in_stack_ffffffffffffff30,&in_stack_ffffffffffffff28->state);
  local_28._M_cur = (__node_type *)ObtainVertexFromVertexMap(in_RDI,in_RSI);
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x10483c)
  ;
  __args = vertex_iterator::operator->((vertex_iterator *)0x104849);
  this_00 = (list<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge,_std::allocator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>_>
             *)&stack0xffffffffffffffa0;
  std::shared_ptr<xmotion::StateExample>::shared_ptr
            (in_stack_ffffffffffffff30,&in_stack_ffffffffffffff28->state);
  local_50[0]._M_node =
       (_List_node_base *)
       Vertex::FindEdge<std::shared_ptr<xmotion::StateExample>,_nullptr>
                 (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::shared_ptr<xmotion::StateExample>::~shared_ptr((shared_ptr<xmotion::StateExample> *)0x10488f)
  ;
  vertex_iterator::operator->((vertex_iterator *)0x10489c);
  local_68._M_node = (_List_node_base *)Vertex::edge_end(in_stack_ffffffffffffff28);
  bVar1 = std::operator!=(local_50,&local_68);
  if (bVar1) {
    dVar4 = local_20;
    pEVar2 = std::
             _List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>
             ::operator->((_List_iterator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Edge>
                           *)0x1048e0);
    pEVar2->cost = dVar4;
    poVar3 = std::operator<<((ostream *)&std::cout,"updated cost: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_20);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    std::shared_ptr<xmotion::StateExample>::shared_ptr(&local_80,&in_stack_ffffffffffffff28->state);
    __x._M_cur = (__node_type *)ObtainVertexFromVertexMap(in_RDI,in_RSI);
    local_70._M_cur = __x._M_cur;
    std::shared_ptr<xmotion::StateExample>::~shared_ptr
              ((shared_ptr<xmotion::StateExample> *)0x1049aa);
    vertex_iterator::operator->((vertex_iterator *)0x1049b4);
    std::__cxx11::
    list<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::vertex_iterator,_std::allocator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::vertex_iterator>_>
    ::push_back(in_stack_ffffffffffffff40,(value_type *)__x._M_cur);
    vertex_iterator::operator->((vertex_iterator *)0x1049d5);
    std::__cxx11::
    list<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,double,xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>>>::Edge,std::allocator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,double,xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>>>::Edge>>
    ::
    emplace_back<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,double,xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>>>::vertex_iterator&,xmotion::Graph<std::shared_ptr<xmotion::StateExample>,double,xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>>>::vertex_iterator&,double&>
              (this_00,(vertex_iterator *)__args,(vertex_iterator *)in_stack_ffffffffffffff40,
               (double *)__x._M_cur);
  }
  return;
}

Assistant:

void Graph<State, Transition, StateIndexer>::AddEdge(State sstate, State dstate,
                                                     Transition trans) {
  auto src_vertex = ObtainVertexFromVertexMap(sstate);

  // update transition if edge already exists
  auto it = src_vertex->FindEdge(dstate);
  if (it != src_vertex->edge_end()) {
    it->cost = trans;
    std::cout << "updated cost: " << trans << std::endl;
    return;
  }

  // otherwise add new edge
  auto dst_vertex = ObtainVertexFromVertexMap(dstate);
  dst_vertex->vertices_from.push_back(src_vertex);
  src_vertex->edges_to.emplace_back(src_vertex, dst_vertex, trans);
}